

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

Range bssl::FirstUnmarkedRangeInByte(uint8_t b)

{
  ulong uVar1;
  ulong uVar2;
  undefined3 in_register_00000039;
  Range RVar3;
  
  uVar1 = 0;
  do {
    if ((CONCAT31(in_register_00000039,b) >> ((uint)uVar1 & 0x1f) & 1) == 0) goto LAB_0017008b;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 8);
  uVar1 = 8;
LAB_0017008b:
  uVar2 = uVar1;
  if (uVar1 < 8) {
    do {
      if ((b >> ((uint)uVar2 & 0x1f) & 1) != 0) goto LAB_001700ae;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 8);
    uVar2 = 8;
  }
LAB_001700ae:
  RVar3.end = uVar2;
  RVar3.start = uVar1;
  return RVar3;
}

Assistant:

static DTLSMessageBitmap::Range FirstUnmarkedRangeInByte(uint8_t b) {
  size_t start, end;
  for (start = 0; start < 8; start++) {
    if ((b & (1u << start)) == 0) {
      break;
    }
  }
  for (end = start; end < 8; end++) {
    if ((b & (1u << end)) != 0) {
      break;
    }
  }
  return DTLSMessageBitmap::Range{start, end};
}